

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageAdd(StackInterpreter *this)

{
  StackMemory *pSVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  uint uVar7;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar8;
  Oop selector;
  double dVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  
  pSVar1 = this->stack;
  puVar2 = (ulong *)(pSVar1->stackFrame).stackPointer;
  puVar3 = (ulong *)*puVar2;
  puVar4 = (ulong *)puVar2[1];
  uVar7 = (uint)puVar3;
  uVar10 = (uint)puVar4;
  if ((uVar7 & uVar10 & 1) != 0) {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
    aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)
            VMContext::signedInt64ObjectFor(this->context,((long)puVar3 >> 1) + ((long)puVar4 >> 1))
    ;
    goto LAB_00147359;
  }
  if ((uVar7 & 7) == 2 && (uVar10 & 7) == 2) {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 1);
    puVar2[1] = (long)(int)(uVar10 + (uVar7 & 0xfffffff8));
    return;
  }
  if ((((((ulong)puVar4 & 1) == 0) && ((uVar10 & 6) != 4)) &&
      ((((ulong)puVar4 & 6) != 0 || ((uint)(*puVar4 >> 0x2a) != 0x22)))) ||
     (((((ulong)puVar3 & 1) == 0 && ((uVar7 & 6) != 4)) &&
      ((((ulong)puVar3 & 6) != 0 || ((uint)(*puVar3 >> 0x2a) != 0x22)))))) {
    selector = VMContext::getSpecialMessageSelector(this->context,Add);
    sendSelectorArgumentCount(this,selector,1,false);
    return;
  }
  sVar5 = this->pc;
  this->pc = sVar5 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar5);
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
  if (((ulong)puVar4 & 1) == 0) {
    uVar10 = uVar10 & 6;
    if (uVar10 != 4) {
      if ((((ulong)puVar4 & 6) != 0) || ((uint)(*puVar4 >> 0x2a) != 0x22)) goto LAB_00147380;
      if (uVar10 != 4) {
        if ((((ulong)puVar4 & 6) != 0) || ((*puVar4 & 0xfffffc0000000000) != 0x880000000000))
        goto LAB_0014739f;
        if (uVar10 != 4) {
          dVar12 = (double)puVar4[1];
          goto LAB_001472d1;
        }
      }
    }
    uVar11 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
    dVar12 = (double)(uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f);
  }
  else {
    dVar12 = (double)((long)puVar4 >> 1);
  }
LAB_001472d1:
  if (((ulong)puVar3 & 1) == 0) {
    uVar7 = uVar7 & 6;
    if (uVar7 != 4) {
      if ((((ulong)puVar3 & 6) != 0) || ((uint)(*puVar3 >> 0x2a) != 0x22)) {
LAB_00147380:
        __assert_fail("isFloatOrInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
      }
      if (uVar7 != 4) {
        if ((((ulong)puVar3 & 6) != 0) || ((*puVar3 & 0xfffffc0000000000) != 0x880000000000)) {
LAB_0014739f:
          __assert_fail("isFloat()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                        ,0x216,"double Lodtalk::Oop::decodeFloat() const");
        }
        if (uVar7 != 4) {
          dVar9 = (double)puVar3[1];
          goto LAB_0014734d;
        }
      }
    }
    uVar11 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
    dVar9 = (double)(uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f);
  }
  else {
    dVar9 = (double)((long)puVar3 >> 1);
  }
LAB_0014734d:
  aVar8 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::floatObjectFor(this->context,dVar12 + dVar9)
  ;
LAB_00147359:
  puVar6 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar6 + -8;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar6 + -8) = aVar8;
  return;
}

Assistant:

void interpretSpecialMessageAdd()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushIntegerObject(ia + ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca + cb));
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa + fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Add, 1);
        }
    }